

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

int pk_write_pubkey_simple(mbedtls_pk_context *key,uchar *buf,size_t size)

{
  int iVar1;
  size_t len;
  uchar *c;
  size_t sStack_28;
  int ret;
  size_t size_local;
  uchar *buf_local;
  mbedtls_pk_context *key_local;
  
  c._4_4_ = 0xffffff92;
  len = (size_t)(buf + size);
  sStack_28 = size;
  size_local = (size_t)buf;
  buf_local = (uchar *)key;
  iVar1 = mbedtls_pk_write_pubkey((uchar **)&len,buf,key);
  return iVar1;
}

Assistant:

static int pk_write_pubkey_simple( mbedtls_pk_context *key,
                                   unsigned char *buf, size_t size )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char *c;
    size_t len = 0;

    c = buf + size;

    MBEDTLS_ASN1_CHK_ADD( len, mbedtls_pk_write_pubkey( &c, buf, key ) );

    return( (int) len );
}